

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uct_node.cpp
# Opt level: O1

void __thiscall megumax::UCTNode::create_children(UCTNode *this,Position *pos,MoveList *move_list)

{
  pointer pMVar1;
  iterator __position;
  double *pdVar2;
  double *prob;
  double *pdVar3;
  Move *move;
  pointer pMVar4;
  double dVar5;
  double local_58;
  UCTNode *local_50;
  UCTNode *local_48;
  MoveList *local_40;
  vector<double,std::allocator<double>> *local_38;
  
  std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::reserve
            (&this->children_,
             (long)(int)((ulong)((long)(move_list->values_).
                                       super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(move_list->values_).
                                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  local_38 = (vector<double,std::allocator<double>> *)&this->probabilities_;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)local_38,
             (long)(int)((ulong)((long)(move_list->values_).
                                       super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(move_list->values_).
                                      super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2));
  pMVar4 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (move_list->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40 = move_list;
  if (pMVar4 == pMVar1) {
    local_58 = 0.0;
  }
  else {
    local_58 = 0.0;
    do {
      local_48 = this;
      std::vector<megumax::UCTNode,std::allocator<megumax::UCTNode>>::
      emplace_back<libchess::Move_const&,megumax::UCTNode*>
                ((vector<megumax::UCTNode,std::allocator<megumax::UCTNode>> *)&this->children_,
                 pMVar4,&local_48);
      local_48 = (UCTNode *)
                 p((this->children_).
                   super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1,pos);
      local_50 = (UCTNode *)0x3ff0000000000000;
      if ((double)local_48 < 30.0) {
        local_50 = (UCTNode *)exp((double)local_48);
      }
      local_48 = local_50;
      __position._M_current =
           (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (local_38,__position,(double *)&local_48);
      }
      else {
        *__position._M_current = (double)local_50;
        (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_58 = local_58 + (double)local_50;
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != pMVar1);
  }
  pdVar3 = (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->probabilities_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar3 != pdVar2) {
    pMVar4 = (local_40->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar1 = (local_40->values_).super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((local_58 != 0.0) ||
         (dVar5 = 1.0 / (double)(int)((ulong)((long)pMVar4 - (long)pMVar1) >> 2), NAN(local_58))) {
        dVar5 = *pdVar3 / local_58;
      }
      *pdVar3 = dVar5;
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != pdVar2);
  }
  return;
}

Assistant:

void UCTNode::create_children(libchess::Position& pos,
                              const libchess::MoveList& move_list) noexcept {
    children_.reserve(move_list.size());
    probabilities_.reserve(move_list.size());

    double sum = 0.0;
    for (const libchess::Move& move : move_list.values()) {
        assert(pos.is_legal_move(move));

        children_.emplace_back(move, this);

        double score = children_.back().p(pos);
        if (score >= 30) {
            score = 1.0;
        } else {
            score = std::exp(score);
        }
        assert(score >= 0.0);
        assert(!std::isnan(score));
        sum += score;

        probabilities_.push_back(score);
    }

    // Softmax
    for (auto& prob : probabilities_) {
        if (sum == 0.0) {
            prob = 1.0 / move_list.size();
        } else {
            prob = prob / sum;
        }
        assert(0.0 <= prob && prob <= 1.0);
    }

#ifndef NDEBUG
    double nsum = 0.0;
    for (auto& prob : probabilities_) {
        nsum += prob;
    }
    assert(std::abs(nsum - 1.0) <= 0.001);
#endif
}